

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseSizeof(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *value;
  undefined4 extraout_var;
  SynSizeof *this;
  Lexeme *end;
  undefined4 extraout_var_00;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_sizeof) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_oparen,"ERROR: sizeof must be followed by \'(\'");
    value = ParseAssignment(ctx);
    if (value == (SynBase *)0x0) {
      anon_unknown.dwarf_153727::Report
                (ctx,ctx->currentLexeme,"ERROR: expression or type not found after sizeof(");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      value = (SynBase *)CONCAT44(extraout_var,iVar1);
      SynError::SynError((SynError *)value,ctx->currentLexeme,ctx->currentLexeme);
    }
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after expression in sizeof");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynSizeof *)CONCAT44(extraout_var_00,iVar1);
    end = ParseContext::Previous(ctx);
    SynSizeof::SynSizeof(this,begin,end,value);
  }
  else {
    this = (SynSizeof *)0x0;
  }
  return &this->super_SynBase;
}

Assistant:

SynBase* ParseSizeof(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_sizeof))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: sizeof must be followed by '('");

		SynBase *value = ParseAssignment(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression or type not found after sizeof(");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after expression in sizeof");

		return new (ctx.get<SynSizeof>()) SynSizeof(start, ctx.Previous(), value);
	}

	return NULL;
}